

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_collect_motion_search_features_sb
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int mi_row,int mi_col,
               BLOCK_SIZE bsize,aom_partition_features_t *features)

{
  int iVar1;
  uint is_sb_size_128_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  SIMPLE_MOTION_DATA_TREE *sms_tree_00;
  void *pvVar9;
  int in_ECX;
  uint *in_RSI;
  AV1_COMP *in_RDI;
  int in_R8D;
  byte in_R9B;
  long in_stack_00000008;
  BLOCK_SIZE in_stack_00000023;
  int in_stack_00000024;
  uint *in_stack_00000028;
  uint *in_stack_00000030;
  int in_stack_0000003c;
  char *in_stack_00000040;
  int i;
  int col;
  int row;
  int idx;
  uint *block_var;
  uint *block_sse;
  int num_blocks;
  int row_steps;
  int col_steps;
  int mi_height;
  int mi_width;
  int ref_list [1];
  TileInfo *tile_info;
  SIMPLE_MOTION_DATA_TREE *sms_root;
  int tree_nodes;
  int is_sb_size_128;
  int stat_generation_stage;
  SIMPLE_MOTION_DATA_TREE *sms_tree;
  int row_step;
  int col_step;
  BLOCK_SIZE fixed_block_size;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  int in_stack_00000488;
  int in_stack_0000048c;
  SIMPLE_MOTION_DATA_TREE *in_stack_00000490;
  MACROBLOCK *in_stack_00000498;
  TileInfo *in_stack_000004a0;
  AV1_COMP *in_stack_000004a8;
  undefined8 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int iVar10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff30;
  BLOCK_SIZE bsize_00;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar11;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb8;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar13;
  AV1_COMMON *cm_00;
  int iVar14;
  byte bVar15;
  int iVar16;
  
  bsize_00 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  iVar14 = (uint)in_R9B << 0x18;
  cm_00 = &in_RDI->common;
  iVar1 = frame_is_intra_only(cm_00);
  if (iVar1 == 0) {
    uVar13 = CONCAT13(6,(int3)in_stack_ffffffffffffffc4);
    uVar12 = 4;
    iVar1 = is_stat_generation_stage(in_RDI);
    is_sb_size_128_00 = (uint)(cm_00->seq_params->sb_size == BLOCK_128X128);
    iVar1 = av1_get_pc_tree_nodes(is_sb_size_128_00,iVar1);
    pvVar8 = aom_calloc(CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (pvVar8 == (void *)0x0) {
      aom_internal_error(cm_00->error,AOM_CODEC_MEM_ERROR,"Failed to allocate sms_tree");
    }
    setup_sms_tree((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (SIMPLE_MOTION_DATA_TREE *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    av1_set_offsets_without_segment_id
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (TileInfo *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,bsize_00);
    av1_init_simple_motion_search_mvs_for_sb
              (in_stack_000004a8,in_stack_000004a0,in_stack_00000498,in_stack_00000490,
               in_stack_0000048c,in_stack_00000488);
    av1_reset_simple_motion_tree_partition
              ((SIMPLE_MOTION_DATA_TREE *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff08 >> 0x38));
    bVar15 = (byte)((uint)iVar14 >> 0x18);
    if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [bVar15] < (cm_00->mi_params).mi_cols - in_R8D) {
      uVar2 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bVar15];
    }
    else {
      uVar2 = (cm_00->mi_params).mi_cols - in_R8D;
    }
    if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bVar15] < (cm_00->mi_params).mi_rows - in_ECX) {
      uVar3 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bVar15];
    }
    else {
      uVar3 = (cm_00->mi_params).mi_rows - in_ECX;
    }
    iVar4 = (int)uVar2 / 4 + (uint)(0 < (int)uVar2 % 4);
    iVar5 = (int)uVar3 / 4 + (uint)(0 < (int)uVar3 % 4);
    iVar6 = iVar4 * iVar5;
    sms_tree_00 = (SIMPLE_MOTION_DATA_TREE *)
                  aom_calloc(CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    pvVar9 = aom_calloc(CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if ((sms_tree_00 == (SIMPLE_MOTION_DATA_TREE *)0x0) || (pvVar9 == (void *)0x0)) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      aom_internal_error(cm_00->error,AOM_CODEC_MEM_ERROR,"Error allocating block_sse & block_var");
    }
    iVar11 = 0;
    iVar10 = in_ECX;
    while( true ) {
      bVar15 = (byte)((uint)iVar14 >> 0x18);
      if ((int)(iVar10 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [bVar15]) < (cm_00->mi_params).mi_rows) {
        iVar7 = iVar10 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [bVar15];
      }
      else {
        iVar7 = (cm_00->mi_params).mi_rows;
      }
      iVar16 = in_R8D;
      if (iVar7 <= in_ECX) break;
      while( true ) {
        bVar15 = (byte)((uint)iVar14 >> 0x18);
        if ((int)(iVar16 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [bVar15]) < (cm_00->mi_params).mi_cols) {
          iVar7 = iVar16 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                 [bVar15];
        }
        else {
          iVar7 = (cm_00->mi_params).mi_cols;
        }
        if (iVar7 <= in_R8D) break;
        in_stack_ffffffffffffff10 = 1;
        simple_motion_search_get_best_ref
                  ((AV1_COMP *)CONCAT44(uVar3,iVar4),(MACROBLOCK *)CONCAT44(iVar5,iVar6),sms_tree_00
                   ,(int)((ulong)pvVar9 >> 0x20),(int)pvVar9,(BLOCK_SIZE)((uint)iVar11 >> 0x18),
                   (int *)CONCAT44(iVar1,in_stack_ffffffffffffffa0),is_sb_size_128_00,(int)pvVar8,
                   in_stack_ffffffffffffffb8,(uint *)CONCAT44(uVar13,uVar12),in_RSI);
        iVar11 = iVar11 + 1;
        in_R8D = in_R8D + 4;
      }
      in_ECX = in_ECX + 4;
      in_R8D = iVar16;
    }
    if (in_stack_00000008 == 0) {
      write_motion_feature_to_file
                (in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_00000028,
                 in_stack_00000024,in_stack_00000023,(BLOCK_SIZE)i,row,(int)block_var);
      in_stack_ffffffffffffff10 = iVar10;
    }
    else {
      *(undefined4 *)(in_stack_00000008 + 0x240) = 0x10;
      *(int *)(in_stack_00000008 + 0x244) = iVar11;
      for (iVar1 = 0; iVar1 < iVar11; iVar1 = iVar1 + 1) {
        *(undefined4 *)(in_stack_00000008 + 0x248 + (long)iVar1 * 4) =
             *(undefined4 *)((long)sms_tree_00->split + (long)iVar1 * 4 + -8);
        *(undefined4 *)(in_stack_00000008 + 0x348 + (long)iVar1 * 4) =
             *(undefined4 *)((long)pvVar9 + (long)iVar1 * 4);
      }
    }
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    aom_free((void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  return;
}

Assistant:

void av1_collect_motion_search_features_sb(AV1_COMP *const cpi, ThreadData *td,
                                           TileDataEnc *tile_data,
                                           const int mi_row, const int mi_col,
                                           const BLOCK_SIZE bsize,
                                           aom_partition_features_t *features) {
  const AV1_COMMON *const cm = &cpi->common;
  if (frame_is_intra_only(cm)) return;

  MACROBLOCK *const x = &td->mb;
  const BLOCK_SIZE fixed_block_size = BLOCK_16X16;
  const int col_step = mi_size_wide[fixed_block_size];
  const int row_step = mi_size_high[fixed_block_size];
  SIMPLE_MOTION_DATA_TREE *sms_tree = NULL;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  CHECK_MEM_ERROR(cm, sms_tree, aom_calloc(tree_nodes, sizeof(*sms_tree)));
  SIMPLE_MOTION_DATA_TREE *sms_root = setup_sms_tree(cpi, sms_tree);
  TileInfo *const tile_info = &tile_data->tile_info;
  av1_set_offsets_without_segment_id(cpi, tile_info, x, mi_row, mi_col, bsize);
  av1_init_simple_motion_search_mvs_for_sb(cpi, NULL, x, sms_root, mi_row,
                                           mi_col);
  av1_reset_simple_motion_tree_partition(sms_root, bsize);
  const int ref_list[] = { cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME
                                                        : LAST_FRAME };
  const int mi_width =
      AOMMIN(mi_size_wide[bsize], cm->mi_params.mi_cols - mi_col);
  const int mi_height =
      AOMMIN(mi_size_high[bsize], cm->mi_params.mi_rows - mi_row);
  const int col_steps = (mi_width / col_step) + ((mi_width % col_step) > 0);
  const int row_steps = (mi_height / row_step) + ((mi_height % row_step) > 0);
  const int num_blocks = col_steps * row_steps;
  unsigned int *block_sse = aom_calloc(num_blocks, sizeof(*block_sse));
  unsigned int *block_var = aom_calloc(num_blocks, sizeof(*block_var));
  if (!(block_sse && block_var)) {
    aom_free(sms_tree);
    aom_free(block_sse);
    aom_free(block_var);
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Error allocating block_sse & block_var");
  }
  int idx = 0;

  for (int row = mi_row;
       row < AOMMIN(mi_row + mi_size_high[bsize], cm->mi_params.mi_rows);
       row += row_step) {
    for (int col = mi_col;
         col < AOMMIN(mi_col + mi_size_wide[bsize], cm->mi_params.mi_cols);
         col += col_step) {
      simple_motion_search_get_best_ref(
          cpi, x, sms_root, row, col, fixed_block_size, ref_list,
          /*num_refs=*/1, /*use_subpixel=*/1,
          /*save_mv=*/1, &block_sse[idx], &block_var[idx]);
      ++idx;
    }
  }
  if (features == NULL) {
    write_motion_feature_to_file(cpi->oxcf.partition_info_path, cpi->sb_counter,
                                 block_sse, block_var, idx, bsize,
                                 fixed_block_size, mi_row, mi_col);
  } else {
    features->sb_features.motion_features.unit_length =
        block_size_wide[fixed_block_size];
    features->sb_features.motion_features.num_units = idx;
    for (int i = 0; i < idx; ++i) {
      features->sb_features.motion_features.block_sse[i] = block_sse[i];
      features->sb_features.motion_features.block_var[i] = block_var[i];
    }
  }

  aom_free(block_sse);
  aom_free(block_var);
  aom_free(sms_tree);
}